

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O3

TIntermTyped * __thiscall
glslang::HlslParseContext::handleVariable(HlslParseContext *this,TSourceLoc *loc,TString *string)

{
  pointer ppTVar1;
  TIntermediate *pTVar2;
  char cVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  TSymbol *pTVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long *plVar8;
  long *plVar9;
  TVariable *this_00;
  TIntermSymbol *pTVar10;
  TIntermConstantUnion *index;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  TPoolAllocator *this_01;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  long lVar11;
  char *pcVar12;
  int thisDepth;
  int local_d4;
  TString *local_d0;
  TType local_c8;
  undefined4 extraout_var_01;
  
  pTVar7 = TSymbolTable::find((this->super_TParseContextBase).symbolTable,string,&local_d4);
  if (pTVar7 == (TSymbol *)0x0) {
LAB_0037c7f9:
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"unknown variable",(string->_M_dataplus)._M_p);
    this_01 = GetThreadPoolAllocator();
    this_00 = (TVariable *)TPoolAllocator::allocate(this_01,0xf8);
    TType::TType(&local_c8,EbtVoid,EvqTemporary,1,0,0,false);
    TVariable::TVariable(this_00,string,string,&local_c8,false);
  }
  else {
    iVar4 = (*pTVar7->_vptr_TSymbol[9])(pTVar7);
    if (CONCAT44(extraout_var,iVar4) != 0) {
      iVar4 = (*pTVar7->_vptr_TSymbol[9])(pTVar7);
      cVar3 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar4) + 0xb0))
                        ((long *)CONCAT44(extraout_var_00,iVar4));
      if (cVar3 != '\0') {
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,loc,"expected symbol, not user-defined type",(string->_M_dataplus)._M_p,"");
        return (TIntermTyped *)0x0;
      }
    }
    iVar4 = (*pTVar7->_vptr_TSymbol[0xb])(pTVar7);
    plVar8 = (long *)CONCAT44(extraout_var_01,iVar4);
    if (plVar8 != (long *)0x0) {
      if ((long)local_d4 < 1) {
LAB_0037c647:
        plVar9 = (long *)(**(code **)(*plVar8 + 0xb0))(plVar8);
        this_00 = (TVariable *)(**(code **)(*plVar9 + 0x50))(plVar9);
      }
      else {
        ppTVar1 = (this->implicitThisStack).
                  super_vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>
                  .
                  super__Vector_base<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        this_00 = ppTVar1[((ulong)((long)(this->implicitThisStack).
                                         super_vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>
                                         .
                                         super__Vector_base<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar1)
                          >> 3) - (long)local_d4];
        if (this_00 == (TVariable *)0x0) {
          (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                    (this,loc,"cannot access member variables (static member function?)","this","");
          goto LAB_0037c647;
        }
      }
      local_d0 = string;
      pTVar10 = TIntermediate::addSymbol
                          ((this->super_TParseContextBase).super_TParseVersions.intermediate,this_00
                           ,loc);
      pTVar2 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
      uVar5 = (**(code **)(*plVar8 + 0xb8))(plVar8);
      index = TIntermediate::addConstantUnion(pTVar2,uVar5,loc,false);
      pTVar10 = (TIntermSymbol *)
                TIntermediate::addIndex
                          ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                           EOpIndexDirectStruct,&pTVar10->super_TIntermTyped,
                           &index->super_TIntermTyped,loc);
      iVar4 = (*(this_00->super_TSymbol)._vptr_TSymbol[0xc])(this_00);
      plVar9 = (long *)CONCAT44(extraout_var_02,iVar4);
      cVar3 = (**(code **)(*plVar9 + 0x128))(plVar9);
      if (cVar3 == '\0') {
LAB_0037c924:
        __assert_fail("isStruct()",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/Types.h"
                      ,0x9df,"const TTypeList *glslang::TType::getStruct() const");
      }
      lVar11 = plVar9[0xd];
      uVar5 = (**(code **)(*plVar8 + 0xb8))(plVar8);
      (*(pTVar10->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1d])
                (pTVar10,*(undefined8 *)(*(long *)(lVar11 + 8) + (ulong)uVar5 * 0x20));
      iVar4 = (*(pTVar10->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(pTVar10);
      cVar3 = (**(code **)(*(long *)CONCAT44(extraout_var_03,iVar4) + 0x18))
                        ((long *)CONCAT44(extraout_var_03,iVar4));
      string = local_d0;
      if (cVar3 != '\0') {
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,loc,"member of nameless block was not redeclared",
                   (local_d0->_M_dataplus)._M_p,"");
      }
      goto LAB_0037c8d5;
    }
    iVar4 = (*pTVar7->_vptr_TSymbol[9])(pTVar7);
    this_00 = (TVariable *)CONCAT44(extraout_var_04,iVar4);
    if (this_00 == (TVariable *)0x0) {
      pcVar12 = "variable name expected";
LAB_0037c7dc:
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,pcVar12,(string->_M_dataplus)._M_p,"");
      goto LAB_0037c7f9;
    }
    iVar4 = (*(this_00->super_TSymbol)._vptr_TSymbol[0xc])(this_00);
    iVar4 = (**(code **)(*(long *)CONCAT44(extraout_var_05,iVar4) + 0x38))
                      ((long *)CONCAT44(extraout_var_05,iVar4));
    if (iVar4 == 0x10) {
LAB_0037c79b:
      iVar4 = (*(this_00->super_TSymbol)._vptr_TSymbol[0xc])(this_00);
      plVar8 = (long *)CONCAT44(extraout_var_07,iVar4);
      cVar3 = (**(code **)(*plVar8 + 0x128))(plVar8);
      if (cVar3 == '\0') goto LAB_0037c924;
      if (plVar8[0xd] == 0) {
        pcVar12 = "cannot be used (maybe an instance name is needed)";
        goto LAB_0037c7dc;
      }
    }
    else {
      iVar4 = (*(this_00->super_TSymbol)._vptr_TSymbol[0xc])(this_00);
      iVar4 = (**(code **)(*(long *)CONCAT44(extraout_var_06,iVar4) + 0x38))
                        ((long *)CONCAT44(extraout_var_06,iVar4));
      if (iVar4 == 0xf) goto LAB_0037c79b;
    }
  }
  iVar4 = (*(this_00->super_TSymbol)._vptr_TSymbol[0xc])(this_00);
  lVar11 = (**(code **)(*(long *)CONCAT44(extraout_var_08,iVar4) + 0x58))
                     ((long *)CONCAT44(extraout_var_08,iVar4));
  pTVar2 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
  if ((*(ulong *)(lVar11 + 8) & 0x10000007f) == 2) {
    iVar4 = (*(this_00->super_TSymbol)._vptr_TSymbol[0x17])(this_00);
    iVar6 = (*(this_00->super_TSymbol)._vptr_TSymbol[0xc])(this_00);
    pTVar10 = (TIntermSymbol *)
              TIntermediate::addConstantUnion
                        (pTVar2,(TConstUnionArray *)CONCAT44(extraout_var_09,iVar4),
                         (TType *)CONCAT44(extraout_var_10,iVar6),loc,false);
  }
  else {
    pTVar10 = TIntermediate::addSymbol(pTVar2,this_00,loc);
  }
LAB_0037c8d5:
  iVar4 = (*(this_00->super_TSymbol)._vptr_TSymbol[0xc])(this_00);
  lVar11 = (**(code **)(*(long *)CONCAT44(extraout_var_11,iVar4) + 0x58))
                     ((long *)CONCAT44(extraout_var_11,iVar4));
  uVar5 = *(uint *)(lVar11 + 8) & 0x7f;
  if ((uVar5 - 0x14 < 0xb) || (uVar5 - 3 < 4)) {
    std::
    _Rb_tree<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>,std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>,std::_Identity<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>>,std::less<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>>,std::allocator<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>>>
    ::
    _M_insert_unique<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>const&>
              ((_Rb_tree<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>,std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>,std::_Identity<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>>,std::less<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>>,std::allocator<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>>>
                *)&((this->super_TParseContextBase).super_TParseVersions.intermediate)->ioAccessed,
               string);
  }
  return &pTVar10->super_TIntermTyped;
}

Assistant:

TIntermTyped* HlslParseContext::handleVariable(const TSourceLoc& loc, const TString* string)
{
    int thisDepth;
    TSymbol* symbol = symbolTable.find(*string, thisDepth);
    if (symbol && symbol->getAsVariable() && symbol->getAsVariable()->isUserType()) {
        error(loc, "expected symbol, not user-defined type", string->c_str(), "");
        return nullptr;
    }

    const TVariable* variable = nullptr;
    const TAnonMember* anon = symbol ? symbol->getAsAnonMember() : nullptr;
    TIntermTyped* node = nullptr;
    if (anon) {
        // It was a member of an anonymous container, which could be a 'this' structure.

        // Create a subtree for its dereference.
        if (thisDepth > 0) {
            variable = getImplicitThis(thisDepth);
            if (variable == nullptr)
                error(loc, "cannot access member variables (static member function?)", "this", "");
        }
        if (variable == nullptr)
            variable = anon->getAnonContainer().getAsVariable();

        TIntermTyped* container = intermediate.addSymbol(*variable, loc);
        TIntermTyped* constNode = intermediate.addConstantUnion(anon->getMemberNumber(), loc);
        node = intermediate.addIndex(EOpIndexDirectStruct, container, constNode, loc);

        node->setType(*(*variable->getType().getStruct())[anon->getMemberNumber()].type);
        if (node->getType().hiddenMember())
            error(loc, "member of nameless block was not redeclared", string->c_str(), "");
    } else {
        // Not a member of an anonymous container.

        // The symbol table search was done in the lexical phase.
        // See if it was a variable.
        variable = symbol ? symbol->getAsVariable() : nullptr;
        if (variable) {
            if ((variable->getType().getBasicType() == EbtBlock ||
                variable->getType().getBasicType() == EbtStruct) && variable->getType().getStruct() == nullptr) {
                error(loc, "cannot be used (maybe an instance name is needed)", string->c_str(), "");
                variable = nullptr;
            }
        } else {
            if (symbol)
                error(loc, "variable name expected", string->c_str(), "");
        }

        // Recovery, if it wasn't found or was not a variable.
        if (variable == nullptr) {
            error(loc, "unknown variable", string->c_str(), "");
            variable = new TVariable(string, TType(EbtVoid));
        }

        if (variable->getType().getQualifier().isFrontEndConstant())
            node = intermediate.addConstantUnion(variable->getConstArray(), variable->getType(), loc);
        else
            node = intermediate.addSymbol(*variable, loc);
    }

    if (variable->getType().getQualifier().isIo())
        intermediate.addIoAccessed(*string);

    return node;
}